

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datapathGen.cpp
# Opt level: O2

void datapathgenerator(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *b,datanode *node)

{
  pointer pbVar1;
  bool bVar2;
  ostream *poVar3;
  int i;
  int i_00;
  int i_01;
  int i_02;
  int i_03;
  int i_04;
  int i_05;
  int i_06;
  int i_07;
  int i_08;
  int i_09;
  int i_10;
  ulong uVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  float fVar8;
  allocator local_41d;
  int local_41c;
  datanode *local_418;
  int local_40c;
  string str [3];
  string local_3a8 [32];
  string *local_388;
  string *local_380;
  string *local_378;
  string *local_370;
  string *local_368;
  string *local_360;
  string *local_358;
  string *local_350;
  string *local_348;
  string *local_340;
  string *local_338;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_41c = nodepointer;
  local_388 = str + 2;
  local_368 = local_3a8;
  local_360 = str + 2;
  iVar6 = 0;
  local_418 = node;
  local_380 = local_388;
  local_378 = local_388;
  local_370 = local_388;
  local_358 = local_360;
  local_350 = local_360;
  local_348 = local_360;
  local_340 = local_360;
  local_338 = local_360;
  do {
    uVar4 = (ulong)iVar6;
    pbVar1 = (b->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(b->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar4) {
      poVar3 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      poVar3 = std::operator<<(poVar3,"Critical Delay : ");
      fVar8 = maxdelay(local_418,local_41c);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,fVar8);
      std::endl<char,std::char_traits<char>>(poVar3);
      return;
    }
    bVar2 = std::operator==(pbVar1 + uVar4,"=");
    if (bVar2) {
      lVar7 = uVar4 + 2;
      bVar2 = std::operator==((b->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + lVar7,"+");
      if (bVar2) {
        lVar5 = uVar4 + 3;
        bVar2 = std::operator==((b->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + lVar5,"1");
        if (bVar2) {
          std::__cxx11::string::string
                    ((string *)str,
                     (string *)
                     ((b->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + uVar4 + 1));
          std::__cxx11::string::string
                    ((string *)(str + 1),
                     (string *)
                     ((b->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + lVar5));
          std::__cxx11::string::string((string *)(str + 2),"",&local_41d);
          std::__cxx11::string::string
                    ((string *)&local_290,
                     (string *)
                     ((b->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + (uVar4 - 1)));
          std::__cxx11::string::string
                    ((string *)&local_50,
                     (string *)
                     ((b->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + lVar7));
          calculateDelayComp(local_418,local_41c,i,str,&local_290,10,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_290);
          lVar7 = 0x40;
          do {
            std::__cxx11::string::~string((string *)((long)&str[0]._M_dataplus._M_p + lVar7));
            lVar7 = lVar7 + -0x20;
          } while (lVar7 != -0x20);
        }
        else {
          std::__cxx11::string::string
                    ((string *)str,
                     (string *)
                     ((b->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + uVar4 + 1));
          std::__cxx11::string::string
                    ((string *)(str + 1),
                     (string *)
                     ((b->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + lVar5));
          std::__cxx11::string::string((string *)(str + 2),"",&local_41d);
          std::__cxx11::string::string
                    ((string *)&local_2b0,
                     (string *)
                     ((b->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + (uVar4 - 1)));
          std::__cxx11::string::string
                    ((string *)&local_70,
                     (string *)
                     ((b->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + lVar7));
          calculateDelayComp(local_418,local_41c,i_01,str,&local_2b0,1,&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_2b0);
          lVar7 = 0x40;
          do {
            std::__cxx11::string::~string((string *)((long)&str[0]._M_dataplus._M_p + lVar7));
            lVar7 = lVar7 + -0x20;
          } while (lVar7 != -0x20);
        }
      }
      else {
        bVar2 = std::operator==((b->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + lVar7,"-");
        if (bVar2) {
          lVar5 = uVar4 + 3;
          bVar2 = std::operator==((b->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + lVar5,"1");
          if (bVar2) {
            std::__cxx11::string::string
                      ((string *)str,
                       (string *)
                       ((b->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + uVar4 + 1));
            std::__cxx11::string::string
                      ((string *)(str + 1),
                       (string *)
                       ((b->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + lVar5));
            std::__cxx11::string::string((string *)(str + 2),"",&local_41d);
            std::__cxx11::string::string
                      ((string *)&local_2d0,
                       (string *)
                       ((b->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + (uVar4 - 1)));
            std::__cxx11::string::string
                      ((string *)&local_90,
                       (string *)
                       ((b->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + lVar7));
            calculateDelayComp(local_418,local_41c,i_00,str,&local_2d0,0xb,&local_90);
            std::__cxx11::string::~string((string *)&local_90);
            std::__cxx11::string::~string((string *)&local_2d0);
            lVar7 = 0x40;
            do {
              std::__cxx11::string::~string((string *)((long)&str[0]._M_dataplus._M_p + lVar7));
              lVar7 = lVar7 + -0x20;
            } while (lVar7 != -0x20);
          }
          else {
            std::__cxx11::string::string
                      ((string *)str,
                       (string *)
                       ((b->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + uVar4 + 1));
            std::__cxx11::string::string
                      ((string *)(str + 1),
                       (string *)
                       ((b->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + lVar5));
            std::__cxx11::string::string((string *)(str + 2),"",&local_41d);
            std::__cxx11::string::string
                      ((string *)&local_2f0,
                       (string *)
                       ((b->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + (uVar4 - 1)));
            std::__cxx11::string::string
                      ((string *)&local_b0,
                       (string *)
                       ((b->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + lVar7));
            calculateDelayComp(local_418,local_41c,i_03,str,&local_2f0,2,&local_b0);
            std::__cxx11::string::~string((string *)&local_b0);
            std::__cxx11::string::~string((string *)&local_2f0);
            lVar7 = 0x40;
            do {
              std::__cxx11::string::~string((string *)((long)&str[0]._M_dataplus._M_p + lVar7));
              lVar7 = lVar7 + -0x20;
            } while (lVar7 != -0x20);
          }
        }
        else {
          bVar2 = std::operator==((b->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + lVar7,">");
          if (((bVar2) ||
              (bVar2 = std::operator==((b->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start + lVar7,"=="),
              bVar2)) ||
             (bVar2 = std::operator==((b->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + lVar7,"<"), bVar2
             )) {
            std::__cxx11::string::string
                      ((string *)str,
                       (string *)
                       ((b->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + uVar4 + 1));
            std::__cxx11::string::string
                      ((string *)(str + 1),
                       (string *)
                       ((b->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + uVar4 + 3));
            std::__cxx11::string::string((string *)(str + 2),"",&local_41d);
            std::__cxx11::string::string
                      ((string *)&local_310,
                       (string *)
                       ((b->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + (uVar4 - 1)));
            std::__cxx11::string::string
                      ((string *)&local_d0,
                       (string *)
                       ((b->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + lVar7));
            calculateDelayComp(local_418,local_41c,i_02,str,&local_310,4,&local_d0);
            std::__cxx11::string::~string((string *)&local_d0);
            std::__cxx11::string::~string((string *)&local_310);
            lVar7 = 0x40;
            do {
              std::__cxx11::string::~string((string *)((long)&str[0]._M_dataplus._M_p + lVar7));
              lVar7 = lVar7 + -0x20;
            } while (lVar7 != -0x20);
          }
          else {
            bVar2 = std::operator==((b->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + lVar7,"*");
            if (bVar2) {
              std::__cxx11::string::string
                        ((string *)str,
                         (string *)
                         ((b->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + uVar4 + 1));
              std::__cxx11::string::string
                        ((string *)(str + 1),
                         (string *)
                         ((b->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + uVar4 + 3));
              std::__cxx11::string::string((string *)(str + 2),"",&local_41d);
              std::__cxx11::string::string
                        ((string *)&local_330,
                         (string *)
                         ((b->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + (uVar4 - 1)));
              std::__cxx11::string::string
                        ((string *)&local_f0,
                         (string *)
                         ((b->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + lVar7));
              calculateDelayComp(local_418,local_41c,i_04,str,&local_330,3,&local_f0);
              std::__cxx11::string::~string((string *)&local_f0);
              std::__cxx11::string::~string((string *)&local_330);
              lVar7 = 0x40;
              do {
                std::__cxx11::string::~string((string *)((long)&str[0]._M_dataplus._M_p + lVar7));
                lVar7 = lVar7 + -0x20;
              } while (lVar7 != -0x20);
            }
            else {
              bVar2 = std::operator==((b->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + lVar7,"?");
              if (!bVar2) {
                local_40c = iVar6 + 2;
                bVar2 = std::operator==((b->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + lVar7,"");
                if (!bVar2) {
                  lVar5 = uVar4 + 3;
                  bVar2 = std::operator==((b->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start + lVar5,"=");
                  if (!bVar2) {
                    bVar2 = std::operator==((b->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start + lVar7,"<<")
                    ;
                    if (bVar2) {
                      std::__cxx11::string::string
                                ((string *)str,
                                 (string *)
                                 ((b->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar4 + 1));
                      std::__cxx11::string::string
                                ((string *)(str + 1),
                                 (string *)
                                 ((b->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + lVar5));
                      std::__cxx11::string::string((string *)(str + 2),"",&local_41d);
                      std::__cxx11::string::string
                                ((string *)&local_190,
                                 (string *)
                                 ((b->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + (uVar4 - 1)));
                      std::__cxx11::string::string
                                ((string *)&local_1b0,
                                 (string *)
                                 ((b->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + lVar7));
                      calculateDelayComp(local_418,local_41c,i_07,str,&local_190,7,&local_1b0);
                      std::__cxx11::string::~string((string *)&local_1b0);
                      std::__cxx11::string::~string((string *)&local_190);
                      lVar7 = 0x40;
                      do {
                        std::__cxx11::string::~string
                                  ((string *)((long)&str[0]._M_dataplus._M_p + lVar7));
                        lVar7 = lVar7 + -0x20;
                        iVar6 = local_40c;
                      } while (lVar7 != -0x20);
                    }
                    else {
                      bVar2 = std::operator==((b->
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start + lVar7,
                                              ">>");
                      if (bVar2) {
                        std::__cxx11::string::string
                                  ((string *)str,
                                   (string *)
                                   ((b->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar4 + 1));
                        std::__cxx11::string::string
                                  ((string *)(str + 1),
                                   (string *)
                                   ((b->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + lVar5));
                        std::__cxx11::string::string((string *)(str + 2),"",&local_41d);
                        std::__cxx11::string::string
                                  ((string *)&local_1d0,
                                   (string *)
                                   ((b->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + (uVar4 - 1)));
                        std::__cxx11::string::string
                                  ((string *)&local_1f0,
                                   (string *)
                                   ((b->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + lVar7));
                        calculateDelayComp(local_418,local_41c,i_08,str,&local_1d0,6,&local_1f0);
                        std::__cxx11::string::~string((string *)&local_1f0);
                        std::__cxx11::string::~string((string *)&local_1d0);
                        lVar7 = 0x40;
                        do {
                          std::__cxx11::string::~string
                                    ((string *)((long)&str[0]._M_dataplus._M_p + lVar7));
                          lVar7 = lVar7 + -0x20;
                          iVar6 = local_40c;
                        } while (lVar7 != -0x20);
                      }
                      else {
                        bVar2 = std::operator==((b->
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                )._M_impl.super__Vector_impl_data._M_start + lVar7,
                                                "/");
                        if (bVar2) {
                          std::__cxx11::string::string
                                    ((string *)str,
                                     (string *)
                                     ((b->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar4 + 1));
                          std::__cxx11::string::string
                                    ((string *)(str + 1),
                                     (string *)
                                     ((b->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + lVar5));
                          std::__cxx11::string::string((string *)(str + 2),"",&local_41d);
                          std::__cxx11::string::string
                                    ((string *)&local_210,
                                     (string *)
                                     ((b->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + (uVar4 - 1)));
                          std::__cxx11::string::string
                                    ((string *)&local_230,
                                     (string *)
                                     ((b->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + lVar7));
                          calculateDelayComp(local_418,local_41c,i_09,str,&local_210,8,&local_230);
                          std::__cxx11::string::~string((string *)&local_230);
                          std::__cxx11::string::~string((string *)&local_210);
                          lVar7 = 0x40;
                          do {
                            std::__cxx11::string::~string
                                      ((string *)((long)&str[0]._M_dataplus._M_p + lVar7));
                            lVar7 = lVar7 + -0x20;
                            iVar6 = local_40c;
                          } while (lVar7 != -0x20);
                        }
                        else {
                          bVar2 = std::operator==((b->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start + lVar7
                                                  ,"%");
                          if (bVar2) {
                            std::__cxx11::string::string
                                      ((string *)str,
                                       (string *)
                                       ((b->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar4 + 1));
                            std::__cxx11::string::string
                                      ((string *)(str + 1),
                                       (string *)
                                       ((b->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + lVar5));
                            std::__cxx11::string::string((string *)(str + 2),"",&local_41d);
                            std::__cxx11::string::string
                                      ((string *)&local_250,
                                       (string *)
                                       ((b->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + (uVar4 - 1)));
                            std::__cxx11::string::string
                                      ((string *)&local_270,
                                       (string *)
                                       ((b->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + lVar7));
                            calculateDelayComp(local_418,local_41c,i_10,str,&local_250,9,&local_270)
                            ;
                            std::__cxx11::string::~string((string *)&local_270);
                            std::__cxx11::string::~string((string *)&local_250);
                            lVar7 = 0x40;
                            do {
                              std::__cxx11::string::~string
                                        ((string *)((long)&str[0]._M_dataplus._M_p + lVar7));
                              lVar7 = lVar7 + -0x20;
                              iVar6 = local_40c;
                            } while (lVar7 != -0x20);
                          }
                        }
                      }
                    }
                    goto LAB_00108fcf;
                  }
                }
                std::__cxx11::string::string
                          ((string *)str,
                           (string *)
                           ((b->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar4 + 1));
                std::__cxx11::string::string((string *)(str + 1),"",&local_41d);
                std::__cxx11::string::string
                          ((string *)&local_150,
                           (string *)
                           ((b->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + (uVar4 - 1)));
                std::__cxx11::string::string((string *)&local_170,"=",&local_41d);
                calculateDelayComp(local_418,local_41c,i_06,str,&local_150,0,&local_170);
                std::__cxx11::string::~string((string *)&local_170);
                std::__cxx11::string::~string((string *)&local_150);
                lVar7 = 0x20;
                do {
                  std::__cxx11::string::~string((string *)((long)&str[0]._M_dataplus._M_p + lVar7));
                  lVar7 = lVar7 + -0x20;
                  iVar6 = local_40c;
                } while (lVar7 != -0x20);
                goto LAB_00108fcf;
              }
              std::__cxx11::string::string
                        ((string *)str,
                         (string *)
                         ((b->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + uVar4 + 1));
              std::__cxx11::string::string
                        ((string *)(str + 1),
                         (string *)
                         ((b->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + uVar4 + 3));
              std::__cxx11::string::string
                        ((string *)(str + 2),
                         (string *)
                         ((b->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + uVar4 + 5));
              std::__cxx11::string::string(local_3a8,"",&local_41d);
              std::__cxx11::string::string
                        ((string *)&local_110,
                         (string *)
                         ((b->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + (uVar4 - 1)));
              std::__cxx11::string::string
                        ((string *)&local_130,
                         (string *)
                         ((b->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + lVar7));
              calculateDelayComp(local_418,local_41c,i_05,str,&local_110,5,&local_130);
              std::__cxx11::string::~string((string *)&local_130);
              std::__cxx11::string::~string((string *)&local_110);
              lVar7 = 0x60;
              do {
                std::__cxx11::string::~string((string *)((long)&str[0]._M_dataplus._M_p + lVar7));
                lVar7 = lVar7 + -0x20;
              } while (lVar7 != -0x20);
            }
          }
        }
      }
      iVar6 = iVar6 + 4;
    }
LAB_00108fcf:
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

void datapathgenerator(vector<string> & b, struct datanode *node)
{
	int i = 0;
	int dsize = nodepointer;
	while (i < b.size()) {
		if (b[i] == "=")
		{
			if (b[i + 2] == "+")
			{
				if (b[i + 3] == "1")
				{
					string str[] = { b[i + 1],b[i + 3],"\0" };
					calculateDelayComp(node, dsize, i, str, b[i - 1], 10,b[i+2]);
					i = i + 4;
				}
				else
				{
					string str[] = { b[i + 1],b[i + 3],"\0" };
					calculateDelayComp(node, dsize, i, str, b[i - 1], 1,b[i+2]);
					i = i + 4;
				}
			}
			else if (b[i + 2] == "-")
			{
					if (b[i + 3] == "1")
				{
					string str[] = { b[i + 1],b[i + 3],"\0" };
					calculateDelayComp(node, dsize, i, str, b[i - 1], 11,b[i+2]);
					i = i + 4;
				}
				else
				{
					string str[] = { b[i + 1],b[i + 3],"\0" };
					calculateDelayComp(node, dsize, i, str, b[i - 1], 2,b[i+2]);
					i = i + 4;
				}
			}
			else if (b[i + 2] == ">" || (b[i + 2] == "==") || (b[i + 2] == "<"))
			{
				string str[] = { b[i + 1],b[i + 3],"\0" };
				calculateDelayComp(node, dsize, i, str, b[i - 1], 4,b[i+2]);
				i = i + 4;
			}
			else if (b[i + 2] == "*")
			{
				string str[] = { b[i + 1],b[i + 3],"\0" };
				calculateDelayComp(node, dsize, i, str, b[i - 1],3,b[i+2]);
				i = i + 4;
			}
			else if (b[i + 2] == "?")
			{
				string str[] = { b[i + 1],b[i + 3],b[i + 5],"\0" };
				calculateDelayComp(node, dsize, i, str, b[i - 1], 5,b[i+2]);
				i = i + 4;
			}

			else if (b[i + 2] == "\0" || b[i+3]=="=")
			{
				string str[] = { b[i + 1],"\0" };
				calculateDelayComp(node, dsize, i, str, b[i - 1], 0,"=");
				i = i + 2;
			}
			else if (b[i + 2] == "<<")
			{

				string str[] = { b[i + 1],b[i + 3],"\0" };
				calculateDelayComp(node, dsize, i, str, b[i - 1], 7,b[i+2]);
				i = i + 2;
			}
			else if (b[i + 2] == ">>")
			{

				string str[] = { b[i + 1],b[i + 3],"\0" };
				calculateDelayComp(node, dsize, i, str, b[i - 1], 6,b[i+2]);
				i = i + 2;
			}
			else if (b[i + 2] == "/")
			{

				string str[] = { b[i + 1],b[i + 3],"\0" };
				calculateDelayComp(node, dsize, i, str, b[i - 1], 8,b[i+2]);
				i = i + 2;
			}
			else if (b[i + 2] == "%")
			{

				string str[] = { b[i + 1],b[i + 3],"\0" };
				calculateDelayComp(node, dsize, i, str, b[i - 1], 9,b[i+2]);
				i = i + 2;
			}
		}
		i++;
	}
	//printNode(node, dsize);
	cout << endl << "Critical Delay : " << maxdelay(node,dsize)<<endl;
}